

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompareValues(xmlXPathParserContextPtr ctxt,int inf,int strict)

{
  double dVar1;
  double dVar2;
  xmlXPathObjectType xVar3;
  xmlXPathObjectType xVar4;
  int iVar5;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr value;
  double dVar6;
  uint uVar7;
  xmlXPathObjectPtr arg;
  double dVar8;
  uint uVar9;
  xmlXPathContextPtr ctxt_00;
  uint uVar10;
  bool bVar11;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return 0;
  }
  if (ctxt->context == (xmlXPathContextPtr)0x0) {
    return 0;
  }
  obj = valuePop(ctxt);
  value = valuePop(ctxt);
  if (obj == (xmlXPathObjectPtr)0x0 || value == (xmlXPathObjectPtr)0x0) {
    ctxt_00 = ctxt->context;
    if (value == (xmlXPathObjectPtr)0x0) {
LAB_001dcee5:
      value = obj;
    }
    xmlXPathReleaseObject(ctxt_00,value);
LAB_001dceed:
    xmlXPathErr(ctxt,10);
    return 0;
  }
  xVar4 = obj->type | XPATH_USERS;
  if (xVar4 != XPATH_XSLT_TREE) {
    xVar3 = value->type;
    if (xVar3 != XPATH_XSLT_TREE) {
      if (xVar3 != XPATH_NUMBER) {
        if (xVar3 == XPATH_NODESET) goto LAB_001dcd3d;
        valuePush(ctxt,value);
        xmlXPathNumberFunction(ctxt,1);
        value = valuePop(ctxt);
      }
      if (value->type != XPATH_NUMBER) {
        xmlXPathFreeObject(value);
        xmlXPathFreeObject(obj);
        goto LAB_001dceed;
      }
      if (obj->type != XPATH_NUMBER) {
        valuePush(ctxt,obj);
        xmlXPathNumberFunction(ctxt,1);
        obj = valuePop(ctxt);
      }
      if (obj->type != XPATH_NUMBER) {
        xmlXPathReleaseObject(ctxt->context,value);
        ctxt_00 = ctxt->context;
        goto LAB_001dcee5;
      }
      dVar1 = value->floatval;
      if (NAN(dVar1)) {
LAB_001dcfb2:
        uVar7 = 0;
        goto LAB_001dcfb4;
      }
      dVar2 = obj->floatval;
      uVar7 = 0;
      if (NAN(dVar2)) goto LAB_001dcfb4;
      dVar6 = ABS(dVar1);
      uVar10 = ((0.0 < dVar1) - 1) + (uint)(0.0 < dVar1);
      if (dVar6 != INFINITY) {
        uVar10 = uVar7;
      }
      dVar8 = ABS(dVar2);
      uVar9 = ((0.0 < dVar2) - 1) + (uint)(0.0 < dVar2);
      if (dVar8 != INFINITY) {
        uVar9 = uVar7;
      }
      if (strict == 0 || inf == 0) {
        if (inf == 0 || strict != 0) {
          if (strict != 0 && inf == 0) {
            uVar7 = 1;
            if ((((0.0 < dVar1) && (uVar9 != 1)) && (dVar6 == INFINITY)) ||
               ((0.0 < dVar1 || dVar6 != INFINITY && (uVar9 == 0xffffffff)))) goto LAB_001dcfb4;
            bVar11 = dVar1 < dVar2;
            goto LAB_001dcebb;
          }
          if (strict != 0 || inf != 0) goto LAB_001dcfb2;
          uVar7 = 1;
          if ((0.0 < dVar1 && dVar6 == INFINITY) || (uVar9 == 0xffffffff)) goto LAB_001dcfb4;
          bVar11 = dVar1 < dVar2;
        }
        else {
          uVar7 = 1;
          if ((uVar10 == 0xffffffff) || (0.0 < dVar2 && dVar8 == INFINITY)) goto LAB_001dcfb4;
          bVar11 = dVar2 < dVar1;
        }
        bVar11 = !bVar11;
      }
      else {
        uVar7 = 1;
        if (((uVar10 == 0xffffffff) && (0.0 < dVar2 || dVar8 != INFINITY)) ||
           ((uVar10 != 1 && 0.0 < dVar2) && dVar8 == INFINITY)) goto LAB_001dcfb4;
        bVar11 = dVar2 < dVar1;
LAB_001dcebb:
        bVar11 = !bVar11 && dVar2 != dVar1;
      }
      uVar7 = (uint)(byte)((dVar6 != INFINITY && dVar8 != INFINITY) & bVar11);
LAB_001dcfb4:
      xmlXPathReleaseObject(ctxt->context,value);
      xmlXPathReleaseObject(ctxt->context,obj);
      return uVar7;
    }
LAB_001dcd3d:
    if (xVar4 != XPATH_XSLT_TREE) goto LAB_001dcd42;
  }
  if ((value->type | XPATH_USERS) == XPATH_XSLT_TREE) {
    iVar5 = xmlXPathCompareNodeSets(inf,strict,value,obj);
    return iVar5;
  }
LAB_001dcd42:
  arg = value;
  if ((value->type | XPATH_USERS) != XPATH_XSLT_TREE) {
    inf = (int)(inf == 0);
    arg = obj;
    obj = value;
  }
  iVar5 = xmlXPathCompareNodeSetValue(ctxt,inf,strict,arg,obj);
  return iVar5;
}

Assistant:

int
xmlXPathCompareValues(xmlXPathParserContextPtr ctxt, int inf, int strict) {
    int ret = 0, arg1i = 0, arg2i = 0;
    xmlXPathObjectPtr arg1, arg2;

    if ((ctxt == NULL) || (ctxt->context == NULL)) return(0);
    arg2 = valuePop(ctxt);
    arg1 = valuePop(ctxt);
    if ((arg1 == NULL) || (arg2 == NULL)) {
	if (arg1 != NULL)
	    xmlXPathReleaseObject(ctxt->context, arg1);
	else
	    xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }

    if ((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE) ||
      (arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
	/*
	 * If either argument is a XPATH_NODESET or XPATH_XSLT_TREE the two arguments
	 * are not freed from within this routine; they will be freed from the
	 * called routine, e.g. xmlXPathCompareNodeSets or xmlXPathCompareNodeSetValue
	 */
	if (((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE)) &&
	  ((arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE))){
	    ret = xmlXPathCompareNodeSets(inf, strict, arg1, arg2);
	} else {
	    if ((arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
		ret = xmlXPathCompareNodeSetValue(ctxt, inf, strict,
			                          arg1, arg2);
	    } else {
		ret = xmlXPathCompareNodeSetValue(ctxt, !inf, strict,
			                          arg2, arg1);
	    }
	}
	return(ret);
    }

    if (arg1->type != XPATH_NUMBER) {
	valuePush(ctxt, arg1);
	xmlXPathNumberFunction(ctxt, 1);
	arg1 = valuePop(ctxt);
    }
    if (arg1->type != XPATH_NUMBER) {
	xmlXPathFreeObject(arg1);
	xmlXPathFreeObject(arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }
    if (arg2->type != XPATH_NUMBER) {
	valuePush(ctxt, arg2);
	xmlXPathNumberFunction(ctxt, 1);
	arg2 = valuePop(ctxt);
    }
    if (arg2->type != XPATH_NUMBER) {
	xmlXPathReleaseObject(ctxt->context, arg1);
	xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }
    /*
     * Add tests for infinity and nan
     * => feedback on 3.4 for Inf and NaN
     */
    /* Hand check NaN and Infinity comparisons */
    if (xmlXPathIsNaN(arg1->floatval) || xmlXPathIsNaN(arg2->floatval)) {
	ret=0;
    } else {
	arg1i=xmlXPathIsInf(arg1->floatval);
	arg2i=xmlXPathIsInf(arg2->floatval);
	if (inf && strict) {
	    if ((arg1i == -1 && arg2i != -1) ||
		(arg2i == 1 && arg1i != 1)) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval < arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (inf && !strict) {
	    if (arg1i == -1 || arg2i == 1) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval <= arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (!inf && strict) {
	    if ((arg1i == 1 && arg2i != 1) ||
		(arg2i == -1 && arg1i != -1)) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval > arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (!inf && !strict) {
	    if (arg1i == 1 || arg2i == -1) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval >= arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
    }
    xmlXPathReleaseObject(ctxt->context, arg1);
    xmlXPathReleaseObject(ctxt->context, arg2);
    return(ret);
}